

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O3

void __thiscall vm_val_t::ll_index(vm_val_t *this,vm_val_t *ret,vm_val_t *idx)

{
  long lVar1;
  uint uVar2;
  ushort *puVar3;
  
  puVar3 = (ushort *)get_as_list(this);
  if (puVar3 != (ushort *)0x0) {
    if (idx->typ == VM_INT) {
      uVar2 = (idx->val).obj;
    }
    else {
      uVar2 = nonint_cast_to_int(idx);
    }
    if ((0 < (int)uVar2) && (uVar2 <= *puVar3)) {
      lVar1 = (ulong)(uVar2 - 1) * 5;
      ret->typ = (int)*(char *)((long)puVar3 + lVar1 + 2);
      vmb_get_dh_val((char *)((long)puVar3 + lVar1 + 2),ret);
      return;
    }
    err_throw(0x7df);
  }
  if (this->typ == VM_OBJ) {
    uVar2 = (this->val).obj;
    CVmObject::index_val_ov
              ((CVmObject *)
               ((long)&G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_ + (ulong)((uVar2 & 0xfff) * 0x18)),
               ret,uVar2,idx);
    return;
  }
  puVar3 = (ushort *)get_as_string(this);
  if (puVar3 != (ushort *)0x0) {
    CVmObjString::parse_num_val(ret,(char *)(puVar3 + 1),(ulong)*puVar3,10,1);
    return;
  }
  ret->typ = VM_NIL;
  return;
}

Assistant:

void vm_val_t::ll_index(VMG_ vm_val_t *ret, const vm_val_t *idx) const
{
    /* try it as a regular list first, then as an object */
    const char *p;
    if ((p = get_as_list(vmg0_)) != 0)
    {
        /* get the index as an integer value */
        int i = idx->cast_to_int(vmg0_);

        /* check the range */
        if (i < 1 || i > (int)vmb_get_len(p))
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /* it's in range - retrieve the element */
        vmb_get_dh(p + VMB_LEN + (size_t)((i - 1) * VMB_DATAHOLDER), ret);
    }
    else if (typ == VM_OBJ)
    {
        /* use the object method, allowing operator overloading */
        vm_objp(vmg_ val.obj)->index_val_ov(vmg_ ret, val.obj, idx);
    }
    else if ((p = get_as_string(vmg0_)) != 0)
    {
        /* string - parse the string as an integer in decimal format */
        CVmObjString::parse_num_val(
            vmg_ ret, p + VMB_LEN, vmb_get_len(p), 10, TRUE);
    }
    else
    {
        /* no value */
        ret->set_nil();
    }
}